

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QGraphicsItem::setAcceptedMouseButtons(QGraphicsItem *this,MouseButtons buttons)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScene *this_00;
  QGraphicsItem *pQVar2;
  
  pQVar1 = (this->d_ptr).d;
  if ((QFlagsStorageHelper<Qt::MouseButton,_4>)(*(uint *)&pQVar1->field_0x160 & 0x1f) !=
      (QFlagsStorage<Qt::MouseButton>)
      buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.i)
  {
    if (((QFlagsStorage<Qt::MouseButton>)
         buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.super_QFlagsStorage<Qt::MouseButton>.
         i == (QFlagsStorage<Qt::MouseButton>)0x0) &&
       (this_00 = (QGraphicsScene *)pQVar1->scene, this_00 != (QGraphicsScene *)0x0)) {
      pQVar2 = QGraphicsScene::mouseGrabberItem(this_00);
      if ((pQVar2 == this) &&
         ((*(byte *)(*(long *)&((this->d_ptr).d)->scene->field_0x8 + 0xb9) & 8) != 0)) {
        ungrabMouse(this);
      }
    }
    pQVar1 = (this->d_ptr).d;
    *(ulong *)&pQVar1->field_0x160 =
         *(ulong *)&pQVar1->field_0x160 & 0xffffffffffffffe0 |
         (ulong)((uint)buttons.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
                       super_QFlagsStorage<Qt::MouseButton>.i & 0x1f);
  }
  return;
}

Assistant:

T *operator->() const noexcept
    {
        return d;
    }